

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O0

zarray_t * apriltag_detector_detect(apriltag_detector_t *td,image_u8_t *im_orig)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  double dVar18;
  uint uVar19;
  uint height;
  timeprofile_t *ptVar20;
  matd_t *pmVar21;
  double (*padVar22) [2];
  apriltag_detection_t *det_00;
  apriltag_detection_t *det_01;
  zarray_t *pzVar23;
  zarray_t *polya;
  unsigned_long uVar24;
  int iVar25;
  workerpool_t *pwVar26;
  long lVar27;
  image_u8_t *piVar28;
  FILE *pFVar29;
  image_u8x3_t *im;
  undefined1 *p;
  int iVar30;
  float fVar31;
  ulong uVar32;
  float fVar33;
  float fVar34;
  double dVar35;
  undefined8 local_270;
  undefined1 auStack_268 [12];
  int local_25c;
  long local_258;
  int local_24c;
  long local_248;
  int local_23c;
  long local_238;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  undefined1 *local_218;
  image_u8_t *local_210;
  int local_204;
  int local_200;
  int local_1fc;
  long local_1f8;
  quad *quad_2;
  int i_12;
  int i_11;
  int bias_4;
  float rgb_2 [3];
  quad *q_1;
  int i_10;
  double scale_1;
  image_u8_t *darker_2;
  FILE *f_1;
  int local_1a8;
  int k_2;
  int j;
  int i_9;
  int bias_3;
  float rgb_1 [3];
  apriltag_detection_t *det_1;
  int local_180;
  int i_8;
  int x_1;
  int y_1;
  image_u8x3_t *out;
  image_u8_t *darker_1;
  int i_7;
  int bias_2;
  float rgb [3];
  apriltag_detection_t *det;
  int i_6;
  double scale;
  FILE *f;
  image_u8_t *darker;
  int local_120;
  int i_5;
  int pref;
  int k_1;
  apriltag_detection_t *det1;
  int i1;
  int k;
  apriltag_detection_t *det0;
  zarray_t *pzStack_f8;
  int i0;
  zarray_t *poly1;
  zarray_t *poly0;
  int color_1;
  int bias_1;
  quad *quad_1;
  image_u8_t *piStack_d0;
  int i_4;
  image_u8_t *im_quads_1;
  int i_3;
  int ntasks;
  unsigned_long __vla_expr0;
  int local_ac;
  image_u8_t *piStack_a8;
  int chunksize;
  image_u8_t *im_samples;
  int color;
  int bias;
  quad *quad;
  image_u8_t *piStack_88;
  int i_2;
  image_u8_t *im_quads;
  zarray_t *detections;
  long lStack_70;
  int i_1;
  quad *q;
  zarray_t *pzStack_60;
  int i;
  zarray_t *quads;
  uint local_50;
  int v;
  int vblur;
  int vorig;
  int x;
  int y;
  image_u8_t *orig;
  int ksz;
  float sigma;
  image_u8_t *quad_im;
  zarray_t *s;
  image_u8_t *im_orig_local;
  apriltag_detector_t *td_local;
  
  local_270 = 0x10ac50;
  s = (zarray_t *)im_orig;
  im_orig_local = (image_u8_t *)td;
  iVar25 = zarray_size(td->tag_families);
  if (iVar25 == 0) {
    local_270 = 0x10ac5f;
    quad_im = (image_u8_t *)zarray_create(8);
    local_270 = 0x10ac71;
    printf("apriltag.c: No tag families enabled.");
    return (zarray_t *)quad_im;
  }
  if (im_orig_local[3].buf != (uint8_t *)0x0) {
    local_1fc = im_orig_local->width;
    local_270 = 0x10aca2;
    iVar25 = workerpool_get_nthreads((workerpool_t *)im_orig_local[3].buf);
    if (local_1fc == iVar25) goto LAB_0010acd1;
  }
  local_270 = 0x10acbb;
  workerpool_destroy((workerpool_t *)im_orig_local[3].buf);
  local_270 = 0x10acc6;
  pwVar26 = workerpool_create(im_orig_local->width);
  im_orig_local[3].buf = (uint8_t *)pwVar26;
LAB_0010acd1:
  local_270 = 0x10acde;
  timeprofile_clear(*(timeprofile_t **)&im_orig_local[2].stride);
  local_270 = 0x10acf2;
  timeprofile_stamp(*(timeprofile_t **)&im_orig_local[2].stride,"init");
  _ksz = s;
  if (1.0 < (float)im_orig_local->height) {
    local_270 = 0x10ad22;
    _ksz = (zarray_t *)image_u8_decimate((image_u8_t *)s,(float)im_orig_local->height);
    local_270 = 0x10ad3a;
    timeprofile_stamp(*(timeprofile_t **)&im_orig_local[2].stride,"decimate");
  }
  if (((float)im_orig_local->stride != 0.0) || (NAN((float)im_orig_local->stride))) {
    orig._4_4_ = ABS((float)im_orig_local->stride);
    orig._0_4_ = (uint)(orig._4_4_ * 4.0);
    if (((uint)orig & 1) == 0) {
      orig._0_4_ = (uint)orig + 1;
    }
    if (1 < (int)(uint)orig) {
      if ((float)im_orig_local->stride <= 0.0) {
        local_270 = 0x10add1;
        _x = image_u8_copy((image_u8_t *)_ksz);
        local_270 = 0x10adea;
        image_u8_gaussian_blur((image_u8_t *)_ksz,(double)orig._4_4_,(uint)orig);
        for (vorig = 0; vorig < _x->height; vorig = vorig + 1) {
          for (vblur = 0; vblur < _x->width; vblur = vblur + 1) {
            v = (int)_x->buf[vorig * _x->stride + vblur];
            local_50 = (uint)(byte)_ksz->data[vorig * _ksz->size + vblur];
            quads._4_4_ = v * 2 - local_50;
            if (quads._4_4_ < 0) {
              quads._4_4_ = 0;
            }
            if (0xff < quads._4_4_) {
              quads._4_4_ = 0xff;
            }
            _ksz->data[vorig * _ksz->size + vblur] = (uint8_t)quads._4_4_;
          }
        }
        local_270 = 0x10aec7;
        image_u8_destroy(_x);
      }
      else {
        local_270 = 0x10adc3;
        image_u8_gaussian_blur((image_u8_t *)_ksz,(double)orig._4_4_,(uint)orig);
      }
    }
  }
  local_270 = 0x10aedf;
  timeprofile_stamp(*(timeprofile_t **)&im_orig_local[2].stride,"blur/sharp");
  if (im_orig_local[1].width != 0) {
    local_270 = 0x10aef9;
    image_u8_write_pnm((image_u8_t *)_ksz,"debug_preprocess.pnm");
  }
  local_270 = 0x10af06;
  pzStack_60 = apriltag_quad_thresh((apriltag_detector_t *)im_orig_local,(image_u8_t *)_ksz);
  if (1.0 < (float)im_orig_local->height) {
    q._4_4_ = 0;
    while( true ) {
      local_200 = q._4_4_;
      local_270 = 0x10af3d;
      iVar25 = zarray_size(pzStack_60);
      if (iVar25 <= local_200) break;
      local_270 = 0x10af5d;
      zarray_get_volatile(pzStack_60,q._4_4_,&stack0xffffffffffffff90);
      for (detections._4_4_ = 0; detections._4_4_ < 4; detections._4_4_ = detections._4_4_ + 1) {
        if (((float)im_orig_local->height != 1.5) || (NAN((float)im_orig_local->height))) {
          *(float *)(lStack_70 + (long)detections._4_4_ * 8) =
               (*(float *)(lStack_70 + (long)detections._4_4_ * 8) - 0.5) *
               (float)im_orig_local->height + 0.5;
          *(float *)(lStack_70 + 4 + (long)detections._4_4_ * 8) =
               (*(float *)(lStack_70 + 4 + (long)detections._4_4_ * 8) - 0.5) *
               (float)im_orig_local->height + 0.5;
        }
        else {
          *(float *)(lStack_70 + (long)detections._4_4_ * 8) =
               (float)im_orig_local->height * *(float *)(lStack_70 + (long)detections._4_4_ * 8);
          *(float *)(lStack_70 + 4 + (long)detections._4_4_ * 8) =
               (float)im_orig_local->height * *(float *)(lStack_70 + 4 + (long)detections._4_4_ * 8)
          ;
        }
      }
      q._4_4_ = q._4_4_ + 1;
    }
  }
  if (_ksz != s) {
    local_270 = 0x10b095;
    image_u8_destroy((image_u8_t *)_ksz);
  }
  local_270 = 0x10b09f;
  im_quads = (image_u8_t *)zarray_create(8);
  local_270 = 0x10b0ac;
  iVar25 = zarray_size(pzStack_60);
  im_orig_local[3].width = iVar25;
  local_270 = 0x10b0c9;
  timeprofile_stamp(*(timeprofile_t **)&im_orig_local[2].stride,"quads");
  if (im_orig_local[1].width != 0) {
    local_270 = 0x10b0e0;
    piStack_88 = image_u8_copy((image_u8_t *)s);
    local_270 = 0x10b0ed;
    image_u8_darken(piStack_88);
    local_270 = 0x10b0f6;
    image_u8_darken(piStack_88);
    local_270 = 0x10b0fd;
    srandom(0);
    quad._4_4_ = 0;
    while( true ) {
      local_204 = quad._4_4_;
      local_270 = 0x10b11c;
      iVar25 = zarray_size(pzStack_60);
      if (iVar25 <= local_204) break;
      local_270 = 0x10b142;
      zarray_get_volatile(pzStack_60,quad._4_4_,&color);
      im_samples._4_4_ = 100;
      local_270 = 0x10b151;
      lVar27 = random();
      im_samples._0_4_ = (int)(lVar27 % 0x9b) + 100;
      local_270 = 0x10b1aa;
      image_u8_draw_line(piStack_88,*_color,_color[1],_color[2],_color[3],(int)im_samples,1);
      local_270 = 0x10b1ee;
      image_u8_draw_line(piStack_88,_color[2],_color[3],_color[4],_color[5],(int)im_samples,1);
      local_270 = 0x10b232;
      image_u8_draw_line(piStack_88,_color[4],_color[5],_color[6],_color[7],(int)im_samples,1);
      local_270 = 0x10b275;
      image_u8_draw_line(piStack_88,_color[6],_color[7],*_color,_color[1],(int)im_samples,1);
      quad._4_4_ = quad._4_4_ + 1;
    }
    local_270 = 0x10b299;
    image_u8_write_pnm(piStack_88,"debug_quads_raw.pnm");
    local_270 = 0x10b2a2;
    image_u8_destroy(piStack_88);
  }
  if (im_orig_local[1].width == 0) {
    local_210 = (image_u8_t *)0x0;
  }
  else {
    local_270 = 0x10b2b5;
    local_210 = image_u8_copy((image_u8_t *)s);
  }
  piStack_a8 = local_210;
  local_270 = 0x10b2e0;
  iVar25 = zarray_size(pzStack_60);
  local_ac = iVar25 / (im_orig_local->width * 10) + 1;
  local_270 = 0x10b301;
  iVar25 = zarray_size(pzStack_60);
  _i_3 = (ulong)(iVar25 / local_ac + 1);
  lVar27 = _i_3 * -0x30;
  local_218 = auStack_268 + lVar27;
  im_quads_1._4_4_ = 0;
  im_quads_1._0_4_ = 0;
  __vla_expr0 = (unsigned_long)auStack_268;
  while( true ) {
    pzVar23 = pzStack_60;
    local_21c = (int)im_quads_1;
    *(undefined8 *)(auStack_268 + lVar27 + -8) = 0x10b361;
    iVar25 = zarray_size(pzVar23);
    pzVar23 = pzStack_60;
    if (iVar25 <= local_21c) break;
    *(int *)(local_218 + (long)im_quads_1._4_4_ * 0x30) = (int)im_quads_1;
    *(undefined8 *)(auStack_268 + lVar27 + -8) = 0x10b397;
    iVar25 = zarray_size(pzVar23);
    iVar30 = (int)im_quads_1 + local_ac;
    *(undefined8 *)(auStack_268 + lVar27 + -8) = 0x10b3aa;
    iVar25 = imin(iVar25,iVar30);
    *(int *)(local_218 + (long)im_quads_1._4_4_ * 0x30 + 4) = iVar25;
    *(zarray_t **)(local_218 + (long)im_quads_1._4_4_ * 0x30 + 8) = pzStack_60;
    *(image_u8_t **)(local_218 + (long)im_quads_1._4_4_ * 0x30 + 0x10) = im_orig_local;
    *(zarray_t **)(local_218 + (long)im_quads_1._4_4_ * 0x30 + 0x18) = s;
    *(image_u8_t **)(local_218 + (long)im_quads_1._4_4_ * 0x30 + 0x20) = im_quads;
    *(image_u8_t **)(local_218 + (long)im_quads_1._4_4_ * 0x30 + 0x28) = piStack_a8;
    pwVar26 = (workerpool_t *)im_orig_local[3].buf;
    p = local_218 + (long)im_quads_1._4_4_ * 0x30;
    *(undefined8 *)(auStack_268 + lVar27 + -8) = 0x10b469;
    workerpool_add_task(pwVar26,quad_decode_task,p);
    im_quads_1._4_4_ = im_quads_1._4_4_ + 1;
    im_quads_1._0_4_ = local_ac + (int)im_quads_1;
  }
  pwVar26 = (workerpool_t *)im_orig_local[3].buf;
  *(undefined8 *)(auStack_268 + lVar27 + -8) = 0x10b49c;
  workerpool_run(pwVar26);
  piVar28 = piStack_a8;
  if (piStack_a8 != (image_u8_t *)0x0) {
    *(undefined8 *)(auStack_268 + lVar27 + -8) = 0x10b4b9;
    image_u8_write_pnm(piVar28,"debug_samples.pnm");
    piVar28 = piStack_a8;
    *(undefined8 *)(auStack_268 + lVar27 + -8) = 0x10b4c5;
    image_u8_destroy(piVar28);
  }
  pzVar23 = s;
  uVar24 = __vla_expr0;
  if (im_orig_local[1].width != 0) {
    *(undefined8 *)(__vla_expr0 - 8) = 0x10b4e6;
    piVar28 = image_u8_copy((image_u8_t *)pzVar23);
    piStack_d0 = piVar28;
    *(undefined8 *)(uVar24 - 8) = 0x10b4f9;
    image_u8_darken(piVar28);
    piVar28 = piStack_d0;
    *(undefined8 *)(uVar24 - 8) = 0x10b505;
    image_u8_darken(piVar28);
    *(undefined8 *)(uVar24 - 8) = 0x10b50c;
    srandom(0);
    quad_1._4_4_ = 0;
    while( true ) {
      pzVar23 = pzStack_60;
      local_220 = quad_1._4_4_;
      *(undefined8 *)(uVar24 - 8) = 0x10b52b;
      iVar30 = zarray_size(pzVar23);
      pzVar23 = pzStack_60;
      piVar28 = piStack_d0;
      iVar25 = quad_1._4_4_;
      if (iVar30 <= local_220) break;
      *(undefined8 *)(uVar24 - 8) = 0x10b551;
      zarray_get_volatile(pzVar23,iVar25,&color_1);
      poly0._4_4_ = 100;
      *(undefined8 *)(uVar24 - 8) = 0x10b560;
      lVar27 = random();
      piVar28 = piStack_d0;
      iVar25 = (int)(lVar27 % 0x9b) + 100;
      fVar31 = *_color_1;
      fVar33 = _color_1[1];
      fVar34 = _color_1[2];
      fVar1 = _color_1[3];
      poly0._0_4_ = iVar25;
      *(undefined8 *)(uVar24 - 8) = 0x10b5bc;
      image_u8_draw_line(piVar28,fVar31,fVar33,fVar34,fVar1,iVar25,1);
      piVar28 = piStack_d0;
      iVar25 = (int)poly0;
      fVar31 = _color_1[2];
      fVar33 = _color_1[3];
      fVar34 = _color_1[4];
      fVar1 = _color_1[5];
      *(undefined8 *)(uVar24 - 8) = 0x10b603;
      image_u8_draw_line(piVar28,fVar31,fVar33,fVar34,fVar1,iVar25,1);
      piVar28 = piStack_d0;
      iVar25 = (int)poly0;
      fVar31 = _color_1[4];
      fVar33 = _color_1[5];
      fVar34 = _color_1[6];
      fVar1 = _color_1[7];
      *(undefined8 *)(uVar24 - 8) = 0x10b64a;
      image_u8_draw_line(piVar28,fVar31,fVar33,fVar34,fVar1,iVar25,1);
      piVar28 = piStack_d0;
      iVar25 = (int)poly0;
      fVar31 = _color_1[6];
      fVar33 = _color_1[7];
      fVar34 = *_color_1;
      fVar1 = _color_1[1];
      *(undefined8 *)(uVar24 - 8) = 0x10b690;
      image_u8_draw_line(piVar28,fVar31,fVar33,fVar34,fVar1,iVar25,1);
      quad_1._4_4_ = quad_1._4_4_ + 1;
    }
    *(undefined8 *)(uVar24 - 8) = 0x10b6b7;
    image_u8_write_pnm(piVar28,"debug_quads_fixed.pnm");
    piVar28 = piStack_d0;
    *(undefined8 *)(uVar24 - 8) = 0x10b6c3;
    image_u8_destroy(piVar28);
  }
  ptVar20 = *(timeprofile_t **)&im_orig_local[2].stride;
  *(undefined8 *)(uVar24 - 8) = 0x10b6d7;
  timeprofile_stamp(ptVar20,"decode+refinement");
  *(undefined8 *)(uVar24 - 8) = 0x10b6e1;
  poly1 = g2d_polygon_create_zeros(4);
  *(undefined8 *)(uVar24 - 8) = 0x10b6f2;
  pzStack_f8 = g2d_polygon_create_zeros(4);
  det0._4_4_ = 0;
  do {
    piVar28 = im_quads;
    local_224 = det0._4_4_;
    *(undefined8 *)(uVar24 - 8) = 0x10b718;
    iVar30 = zarray_size((zarray_t *)piVar28);
    piVar28 = im_quads;
    pzVar23 = poly1;
    iVar25 = det0._4_4_;
    if (iVar30 <= local_224) {
      *(undefined8 *)(uVar24 - 8) = 0x10ba7a;
      zarray_destroy(pzVar23);
      pzVar23 = pzStack_f8;
      *(undefined8 *)(uVar24 - 8) = 0x10ba86;
      zarray_destroy(pzVar23);
      ptVar20 = *(timeprofile_t **)&im_orig_local[2].stride;
      *(undefined8 *)(uVar24 - 8) = 0x10ba9a;
      timeprofile_stamp(ptVar20,"reconcile");
      pzVar23 = s;
      if (im_orig_local[1].width != 0) {
        *(undefined8 *)(uVar24 - 8) = 0x10bab1;
        piVar28 = image_u8_copy((image_u8_t *)pzVar23);
        *(undefined8 *)(uVar24 - 8) = 0x10bac4;
        image_u8_darken(piVar28);
        *(undefined8 *)(uVar24 - 8) = 0x10bad0;
        image_u8_darken(piVar28);
        *(undefined8 *)(uVar24 - 8) = 0x10bae3;
        pFVar29 = fopen("debug_output.ps","w");
        *(undefined8 *)(uVar24 - 8) = 0x10baff;
        fprintf(pFVar29,"%%!PS\n\n");
        dVar35 = 612.0 / (double)piVar28->width;
        dVar7 = 792.0 / (double)piVar28->height;
        dVar8 = dVar7;
        if (dVar35 <= dVar7) {
          dVar8 = dVar35;
        }
        uVar32 = ~-(ulong)NAN(dVar35) & (ulong)dVar8 | -(ulong)NAN(dVar35) & (ulong)dVar7;
        *(undefined8 *)(uVar24 - 8) = 0x10bb79;
        fprintf(pFVar29,"%f %f scale\n",uVar32,uVar32);
        uVar19 = piVar28->height;
        *(undefined8 *)(uVar24 - 8) = 0x10bb98;
        fprintf(pFVar29,"0 %d translate\n",(ulong)uVar19);
        *(undefined8 *)(uVar24 - 8) = 0x10bbad;
        fprintf(pFVar29,"1 -1 scale\n");
        *(undefined8 *)(uVar24 - 8) = 0x10bbc0;
        postscript_image((FILE *)pFVar29,piVar28);
        *(undefined8 *)(uVar24 - 8) = 0x10bbcc;
        image_u8_destroy(piVar28);
        det._4_4_ = 0;
        while( true ) {
          piVar28 = im_quads;
          local_22c = det._4_4_;
          *(undefined8 *)(uVar24 - 8) = 0x10bbeb;
          iVar25 = zarray_size((zarray_t *)piVar28);
          piVar28 = im_quads;
          if (iVar25 <= local_22c) break;
          *(undefined8 *)(uVar24 - 8) = 0x10bc11;
          zarray_get((zarray_t *)piVar28,det._4_4_,rgb + 1);
          for (darker_1._4_4_ = 0; darker_1._4_4_ < 3; darker_1._4_4_ = darker_1._4_4_ + 1) {
            local_238 = 100;
            *(undefined8 *)(uVar24 - 8) = 0x10bc41;
            lVar27 = random();
            (&i_7)[darker_1._4_4_] = (int)(float)(local_238 + lVar27 % 0x9b);
          }
          fVar31 = (float)i_7 / 255.0;
          fVar33 = (float)bias_2 / 255.0;
          fVar34 = rgb[0] / 255.0;
          *(undefined8 *)(uVar24 - 8) = 0x10bce1;
          fprintf(pFVar29,"%f %f %f setrgbcolor\n",(double)fVar31,(double)fVar33,
                  SUB84((double)fVar34,0));
          uVar9 = *(undefined8 *)(rgb._4_8_ + 0x30);
          uVar10 = *(undefined8 *)(rgb._4_8_ + 0x38);
          uVar11 = *(undefined8 *)(rgb._4_8_ + 0x40);
          uVar12 = *(undefined8 *)(rgb._4_8_ + 0x48);
          uVar13 = *(undefined8 *)(rgb._4_8_ + 0x50);
          uVar14 = *(undefined8 *)(rgb._4_8_ + 0x58);
          uVar15 = *(undefined8 *)(rgb._4_8_ + 0x60);
          uVar16 = *(undefined8 *)(rgb._4_8_ + 0x68);
          uVar17 = *(undefined8 *)(rgb._4_8_ + 0x38);
          *(undefined8 *)(uVar24 - 0x10) = *(undefined8 *)(rgb._4_8_ + 0x30);
          *(undefined8 *)(uVar24 - 8) = uVar17;
          *(undefined8 *)(uVar24 - 0x18) = 0x10bd81;
          fprintf(pFVar29,
                  "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",uVar9,
                  uVar10,(int)uVar11,uVar12,(int)uVar13,uVar14,uVar15,uVar16);
          det._4_4_ = det._4_4_ + 1;
        }
        *(undefined8 *)(uVar24 - 8) = 0x10bdae;
        fprintf(pFVar29,"showpage\n");
        *(undefined8 *)(uVar24 - 8) = 0x10bdba;
        fclose(pFVar29);
      }
      pzVar23 = s;
      if (im_orig_local[1].width != 0) {
        *(undefined8 *)(uVar24 - 8) = 0x10bdd1;
        piVar28 = image_u8_copy((image_u8_t *)pzVar23);
        *(undefined8 *)(uVar24 - 8) = 0x10bde4;
        image_u8_darken(piVar28);
        *(undefined8 *)(uVar24 - 8) = 0x10bdf0;
        image_u8_darken(piVar28);
        uVar19 = piVar28->width;
        height = piVar28->height;
        *(undefined8 *)(uVar24 - 8) = 0x10be08;
        im = image_u8x3_create(uVar19,height);
        for (i_8 = 0; i_8 < *(int *)((long)&s->el_sz + 4); i_8 = i_8 + 1) {
          for (local_180 = 0; local_180 < (int)s->el_sz; local_180 = local_180 + 1) {
            im->buf[i_8 * im->stride + local_180 * 3] =
                 piVar28->buf[i_8 * piVar28->stride + local_180];
            im->buf[i_8 * im->stride + local_180 * 3 + 1] =
                 piVar28->buf[i_8 * piVar28->stride + local_180];
            im->buf[i_8 * im->stride + local_180 * 3 + 2] =
                 piVar28->buf[i_8 * piVar28->stride + local_180];
          }
        }
        det_1._4_4_ = 0;
        while( true ) {
          piVar28 = im_quads;
          local_23c = det_1._4_4_;
          *(undefined8 *)(uVar24 - 8) = 0x10bf93;
          iVar25 = zarray_size((zarray_t *)piVar28);
          piVar28 = im_quads;
          if (iVar25 <= local_23c) break;
          *(undefined8 *)(uVar24 - 8) = 0x10bfb9;
          zarray_get((zarray_t *)piVar28,det_1._4_4_,rgb_1 + 1);
          j = 100;
          for (k_2 = 0; k_2 < 3; k_2 = k_2 + 1) {
            local_248 = (long)j;
            *(undefined8 *)(uVar24 - 8) = 0x10bfe9;
            lVar27 = random();
            (&i_9)[k_2] = (int)(float)(local_248 + lVar27 % (long)(0xff - j));
          }
          for (local_1a8 = 0; local_1a8 < 4; local_1a8 = local_1a8 + 1) {
            f_1._4_4_ = local_1a8 + 1U & 3;
            dVar7 = *(double *)(rgb_1._4_8_ + 0x30 + (long)local_1a8 * 0x10);
            dVar8 = *(double *)(rgb_1._4_8_ + 0x38 + (long)local_1a8 * 0x10);
            dVar35 = *(double *)(rgb_1._4_8_ + 0x30 + (long)(int)f_1._4_4_ * 0x10);
            dVar18 = *(double *)(rgb_1._4_8_ + 0x38 + (long)(int)f_1._4_4_ * 0x10);
            f_1._1_1_ = (undefined1)(int)(float)i_9;
            f_1._2_1_ = (undefined1)(int)(float)bias_3;
            f_1._3_1_ = (undefined1)(int)rgb_1[0];
            *(undefined8 *)(uVar24 - 8) = 0x10c0db;
            image_u8x3_draw_line
                      (im,(float)dVar7,(float)dVar8,(float)dVar35,(float)dVar18,
                       (uint8_t *)((long)&f_1 + 1),1);
          }
          det_1._4_4_ = det_1._4_4_ + 1;
        }
        *(undefined8 *)(uVar24 - 8) = 0x10c118;
        image_u8x3_write_pnm(im,"debug_output.pnm");
        *(undefined8 *)(uVar24 - 8) = 0x10c124;
        image_u8x3_destroy(im);
      }
      if (im_orig_local[1].width != 0) {
        *(undefined8 *)(uVar24 - 8) = 0x10c145;
        pFVar29 = fopen("debug_quads.ps","w");
        *(undefined8 *)(uVar24 - 8) = 0x10c161;
        fprintf(pFVar29,"%%!PS\n\n");
        pzVar23 = s;
        *(undefined8 *)(uVar24 - 8) = 0x10c16a;
        piVar28 = image_u8_copy((image_u8_t *)pzVar23);
        *(undefined8 *)(uVar24 - 8) = 0x10c17d;
        image_u8_darken(piVar28);
        *(undefined8 *)(uVar24 - 8) = 0x10c189;
        image_u8_darken(piVar28);
        dVar35 = 612.0 / (double)piVar28->width;
        dVar7 = 792.0 / (double)piVar28->height;
        dVar8 = dVar7;
        if (dVar35 <= dVar7) {
          dVar8 = dVar35;
        }
        uVar32 = ~-(ulong)NAN(dVar35) & (ulong)dVar8 | -(ulong)NAN(dVar35) & (ulong)dVar7;
        *(undefined8 *)(uVar24 - 8) = 0x10c203;
        fprintf(pFVar29,"%f %f scale\n",uVar32,uVar32);
        uVar19 = piVar28->height;
        *(undefined8 *)(uVar24 - 8) = 0x10c222;
        fprintf(pFVar29,"0 %d translate\n",(ulong)uVar19);
        *(undefined8 *)(uVar24 - 8) = 0x10c237;
        fprintf(pFVar29,"1 -1 scale\n");
        *(undefined8 *)(uVar24 - 8) = 0x10c24a;
        postscript_image((FILE *)pFVar29,piVar28);
        *(undefined8 *)(uVar24 - 8) = 0x10c256;
        image_u8_destroy(piVar28);
        q_1._4_4_ = 0;
        while( true ) {
          pzVar23 = pzStack_60;
          local_24c = q_1._4_4_;
          *(undefined8 *)(uVar24 - 8) = 0x10c275;
          iVar25 = zarray_size(pzVar23);
          pzVar23 = pzStack_60;
          if (iVar25 <= local_24c) break;
          *(undefined8 *)(uVar24 - 8) = 0x10c29b;
          zarray_get_volatile(pzVar23,q_1._4_4_,rgb_2 + 1);
          i_12 = 100;
          for (quad_2._4_4_ = 0; quad_2._4_4_ < 3; quad_2._4_4_ = quad_2._4_4_ + 1) {
            local_258 = (long)i_12;
            *(undefined8 *)(uVar24 - 8) = 0x10c2cb;
            lVar27 = random();
            (&i_11)[quad_2._4_4_] = (int)(float)(local_258 + lVar27 % (long)(0xff - i_12));
          }
          fVar31 = (float)i_11 / 255.0;
          fVar33 = (float)bias_4 / 255.0;
          fVar34 = rgb_2[0] / 255.0;
          *(undefined8 *)(uVar24 - 8) = 0x10c36b;
          fprintf(pFVar29,"%f %f %f setrgbcolor\n",(double)fVar31,(double)fVar33,
                  SUB84((double)fVar34,0));
          fVar31 = *(float *)rgb_2._4_8_;
          fVar33 = *(float *)(rgb_2._4_8_ + 4);
          fVar34 = *(float *)(rgb_2._4_8_ + 8);
          fVar1 = *(float *)(rgb_2._4_8_ + 0xc);
          fVar2 = *(float *)(rgb_2._4_8_ + 0x10);
          fVar3 = *(float *)(rgb_2._4_8_ + 0x14);
          fVar4 = *(float *)(rgb_2._4_8_ + 0x18);
          fVar5 = *(float *)(rgb_2._4_8_ + 0x1c);
          fVar6 = *(float *)(rgb_2._4_8_ + 4);
          *(double *)(uVar24 - 0x10) = (double)*(float *)rgb_2._4_8_;
          *(double *)(uVar24 - 8) = (double)fVar6;
          *(undefined8 *)(uVar24 - 0x18) = 0x10c433;
          fprintf(pFVar29,
                  "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",
                  (double)fVar31,(double)fVar33,SUB84((double)fVar34,0),(double)fVar1,
                  SUB84((double)fVar2,0),(double)fVar3,(double)fVar4,(double)fVar5);
          q_1._4_4_ = q_1._4_4_ + 1;
        }
        *(undefined8 *)(uVar24 - 8) = 0x10c460;
        fprintf(pFVar29,"showpage\n");
        *(undefined8 *)(uVar24 - 8) = 0x10c46c;
        fclose(pFVar29);
      }
      ptVar20 = *(timeprofile_t **)&im_orig_local[2].stride;
      *(undefined8 *)(uVar24 - 8) = 0x10c480;
      timeprofile_stamp(ptVar20,"debug output");
      quad_2._0_4_ = 0;
      while( true ) {
        pzVar23 = pzStack_60;
        local_25c = (int)quad_2;
        *(undefined8 *)(uVar24 - 8) = 0x10c49f;
        iVar30 = zarray_size(pzVar23);
        pzVar23 = pzStack_60;
        iVar25 = (int)quad_2;
        if (iVar30 <= local_25c) break;
        *(undefined8 *)(uVar24 - 8) = 0x10c4c1;
        zarray_get_volatile(pzVar23,iVar25,&local_1f8);
        pmVar21 = *(matd_t **)(local_1f8 + 0x28);
        *(undefined8 *)(uVar24 - 8) = 0x10c4d1;
        matd_destroy(pmVar21);
        pmVar21 = *(matd_t **)(local_1f8 + 0x30);
        *(undefined8 *)(uVar24 - 8) = 0x10c4e1;
        matd_destroy(pmVar21);
        quad_2._0_4_ = (int)quad_2 + 1;
      }
      *(undefined8 *)(uVar24 - 8) = 0x10c4fb;
      zarray_destroy(pzVar23);
      piVar28 = im_quads;
      *(undefined8 *)(uVar24 - 8) = 0x10c50b;
      zarray_sort((zarray_t *)piVar28,detection_compare_function);
      ptVar20 = *(timeprofile_t **)&im_orig_local[2].stride;
      *(undefined8 *)(uVar24 - 8) = 0x10c51f;
      timeprofile_stamp(ptVar20,"cleanup");
      return (zarray_t *)im_quads;
    }
    *(undefined8 *)(uVar24 - 8) = 0x10b73e;
    zarray_get((zarray_t *)piVar28,iVar25,&i1);
    for (det1._4_4_ = 0; pzVar23 = poly1, iVar30 = det1._4_4_, iVar25 = det0._4_4_, det1._4_4_ < 4;
        det1._4_4_ = det1._4_4_ + 1) {
      lVar27 = (long)det1._4_4_;
      padVar22 = _i1->p;
      *(undefined8 *)(uVar24 - 8) = 0x10b780;
      zarray_set(pzVar23,iVar30,padVar22 + lVar27,(void *)0x0);
    }
    while( true ) {
      piVar28 = im_quads;
      det1._0_4_ = iVar25 + 1;
      local_228 = (int)det1;
      *(undefined8 *)(uVar24 - 8) = 0x10b7b5;
      iVar30 = zarray_size((zarray_t *)piVar28);
      piVar28 = im_quads;
      iVar25 = (int)det1;
      if (iVar30 <= local_228) break;
      *(undefined8 *)(uVar24 - 8) = 0x10b7db;
      zarray_get((zarray_t *)piVar28,iVar25,&pref);
      iVar25 = (int)det1;
      if ((_i1->id == _pref->id) && (_i1->family == _pref->family)) {
        for (i_5 = 0; polya = poly1, pzVar23 = pzStack_f8, i_5 < 4; i_5 = i_5 + 1) {
          padVar22 = _pref->p;
          *(undefined8 *)(uVar24 - 8) = 0x10b84e;
          zarray_set(pzVar23,i_5,padVar22 + i_5,(void *)0x0);
        }
        *(undefined8 *)(uVar24 - 8) = 0x10b872;
        iVar30 = g2d_polygon_overlaps_polygon(polya,pzVar23);
        iVar25 = (int)det1;
        if (iVar30 != 0) {
          iVar25 = _i1->hamming;
          iVar30 = _pref->hamming;
          *(undefined8 *)(uVar24 - 8) = 0x10b8a8;
          iVar25 = prefer_smaller(0,(double)iVar25,(double)iVar30);
          fVar31 = _i1->decision_margin;
          fVar33 = _pref->decision_margin;
          *(undefined8 *)(uVar24 - 8) = 0x10b8f3;
          local_120 = prefer_smaller(iVar25,(double)-fVar31,(double)-fVar33);
          for (darker._4_4_ = 0; darker._4_4_ < 4; darker._4_4_ = darker._4_4_ + 1) {
            dVar7 = _i1->p[darker._4_4_][0];
            dVar8 = _pref->p[darker._4_4_][0];
            *(undefined8 *)(uVar24 - 8) = 0x10b955;
            iVar25 = prefer_smaller(local_120,dVar7,dVar8);
            dVar7 = _i1->p[darker._4_4_][1];
            dVar8 = _pref->p[darker._4_4_][1];
            *(undefined8 *)(uVar24 - 8) = 0x10b9a2;
            local_120 = prefer_smaller(iVar25,dVar7,dVar8);
          }
          if (local_120 == 0) {
            *(undefined8 *)(uVar24 - 8) = 0x10b9d3;
            printf("uh oh, no preference for overlappingdetection\n");
          }
          det_01 = _i1;
          det_00 = _pref;
          if (-1 < local_120) {
            *(undefined8 *)(uVar24 - 8) = 0x10ba19;
            apriltag_detection_destroy(det_01);
            piVar28 = im_quads;
            iVar25 = det0._4_4_;
            *(undefined8 *)(uVar24 - 8) = 0x10ba2d;
            zarray_remove_index((zarray_t *)piVar28,iVar25,1);
            det0._4_4_ = det0._4_4_ + -1;
            break;
          }
          *(undefined8 *)(uVar24 - 8) = 0x10b9e8;
          apriltag_detection_destroy(det_00);
          piVar28 = im_quads;
          iVar25 = (int)det1;
          *(undefined8 *)(uVar24 - 8) = 0x10b9fc;
          zarray_remove_index((zarray_t *)piVar28,iVar25,1);
          iVar25 = (int)det1 + -1;
        }
      }
    }
    det0._4_4_ = det0._4_4_ + 1;
  } while( true );
}

Assistant:

zarray_t *apriltag_detector_detect(apriltag_detector_t *td, image_u8_t *im_orig)
{
    if (zarray_size(td->tag_families) == 0) {
        zarray_t *s = zarray_create(sizeof(apriltag_detection_t*));
        printf("apriltag.c: No tag families enabled.");
        return s;
    }

    if (td->wp == NULL || td->nthreads != workerpool_get_nthreads(td->wp)) {
        workerpool_destroy(td->wp);
        td->wp = workerpool_create(td->nthreads);
    }

    timeprofile_clear(td->tp);
    timeprofile_stamp(td->tp, "init");

    ///////////////////////////////////////////////////////////
    // Step 1. Detect quads according to requested image decimation
    // and blurring parameters.
    image_u8_t *quad_im = im_orig;
    if (td->quad_decimate > 1) {
        quad_im = image_u8_decimate(im_orig, td->quad_decimate);

        timeprofile_stamp(td->tp, "decimate");
    }

    if (td->quad_sigma != 0) {
        // compute a reasonable kernel width by figuring that the
        // kernel should go out 2 std devs.
        //
        // max sigma          ksz
        // 0.499              1  (disabled)
        // 0.999              3
        // 1.499              5
        // 1.999              7

        float sigma = fabsf((float) td->quad_sigma);

        int ksz = 4 * sigma; // 2 std devs in each direction
        if ((ksz & 1) == 0)
            ksz++;

        if (ksz > 1) {

            if (td->quad_sigma > 0) {
                // Apply a blur
                image_u8_gaussian_blur(quad_im, sigma, ksz);
            } else {
                // SHARPEN the image by subtracting the low frequency components.
                image_u8_t *orig = image_u8_copy(quad_im);
                image_u8_gaussian_blur(quad_im, sigma, ksz);

                for (int y = 0; y < orig->height; y++) {
                    for (int x = 0; x < orig->width; x++) {
                        int vorig = orig->buf[y*orig->stride + x];
                        int vblur = quad_im->buf[y*quad_im->stride + x];

                        int v = 2*vorig - vblur;
                        if (v < 0)
                            v = 0;
                        if (v > 255)
                            v = 255;

                        quad_im->buf[y*quad_im->stride + x] = (uint8_t) v;
                    }
                }
                image_u8_destroy(orig);
            }
        }
    }

    timeprofile_stamp(td->tp, "blur/sharp");

    if (td->debug)
        image_u8_write_pnm(quad_im, "debug_preprocess.pnm");

    zarray_t *quads = apriltag_quad_thresh(td, quad_im);
    
    // adjust centers of pixels so that they correspond to the
    // original full-resolution image.
    if (td->quad_decimate > 1) {
        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *q;
            zarray_get_volatile(quads, i, &q);

            for (int i = 0; i < 4; i++) {
                if (td->quad_decimate == 1.5) {
                    q->p[i][0] *= td->quad_decimate;
                    q->p[i][1] *= td->quad_decimate;
                } else {
                    q->p[i][0] = (q->p[i][0] - 0.5)*td->quad_decimate + 0.5;
                    q->p[i][1] = (q->p[i][1] - 0.5)*td->quad_decimate + 0.5;
                }
            }
        }
    }

    if (quad_im != im_orig)
        image_u8_destroy(quad_im);

    zarray_t *detections = zarray_create(sizeof(apriltag_detection_t*));

    td->nquads = zarray_size(quads);

    timeprofile_stamp(td->tp, "quads");

    if (td->debug) {
        image_u8_t *im_quads = image_u8_copy(im_orig);
        image_u8_darken(im_quads);
        image_u8_darken(im_quads);

        srandom(0);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *quad;
            zarray_get_volatile(quads, i, &quad);

            const int bias = 100;
            int color = bias + (random() % (255-bias));

            image_u8_draw_line(im_quads, quad->p[0][0], quad->p[0][1], quad->p[1][0], quad->p[1][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[1][0], quad->p[1][1], quad->p[2][0], quad->p[2][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[2][0], quad->p[2][1], quad->p[3][0], quad->p[3][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[3][0], quad->p[3][1], quad->p[0][0], quad->p[0][1], color, 1);
        }

        image_u8_write_pnm(im_quads, "debug_quads_raw.pnm");
        image_u8_destroy(im_quads);
    }

    ////////////////////////////////////////////////////////////////
    // Step 2. Decode tags from each quad.
    if (1) {
        image_u8_t *im_samples = td->debug ? image_u8_copy(im_orig) : NULL;

        int chunksize = 1 + zarray_size(quads) / (APRILTAG_TASKS_PER_THREAD_TARGET * td->nthreads);

        struct quad_decode_task tasks[zarray_size(quads) / chunksize + 1];

        int ntasks = 0;
        for (int i = 0; i < zarray_size(quads); i+= chunksize) {
            tasks[ntasks].i0 = i;
            tasks[ntasks].i1 = imin(zarray_size(quads), i + chunksize);
            tasks[ntasks].quads = quads;
            tasks[ntasks].td = td;
            tasks[ntasks].im = im_orig;
            tasks[ntasks].detections = detections;

            tasks[ntasks].im_samples = im_samples;

            workerpool_add_task(td->wp, quad_decode_task, &tasks[ntasks]);
            ntasks++;
        }

        workerpool_run(td->wp);

        if (im_samples != NULL) {
            image_u8_write_pnm(im_samples, "debug_samples.pnm");
            image_u8_destroy(im_samples);
        }
    }

    if (td->debug) {
        image_u8_t *im_quads = image_u8_copy(im_orig);
        image_u8_darken(im_quads);
        image_u8_darken(im_quads);

        srandom(0);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *quad;
            zarray_get_volatile(quads, i, &quad);

            const int bias = 100;
            int color = bias + (random() % (255-bias));

            image_u8_draw_line(im_quads, quad->p[0][0], quad->p[0][1], quad->p[1][0], quad->p[1][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[1][0], quad->p[1][1], quad->p[2][0], quad->p[2][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[2][0], quad->p[2][1], quad->p[3][0], quad->p[3][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[3][0], quad->p[3][1], quad->p[0][0], quad->p[0][1], color, 1);

        }

        image_u8_write_pnm(im_quads, "debug_quads_fixed.pnm");
        image_u8_destroy(im_quads);
    }

    timeprofile_stamp(td->tp, "decode+refinement");

    ////////////////////////////////////////////////////////////////
    // Step 3. Reconcile detections--- don't report the same tag more
    // than once. (Allow non-overlapping duplicate detections.)
    if (1) {
        zarray_t *poly0 = g2d_polygon_create_zeros(4);
        zarray_t *poly1 = g2d_polygon_create_zeros(4);

        for (int i0 = 0; i0 < zarray_size(detections); i0++) {

            apriltag_detection_t *det0;
            zarray_get(detections, i0, &det0);

            for (int k = 0; k < 4; k++)
                zarray_set(poly0, k, det0->p[k], NULL);

            for (int i1 = i0+1; i1 < zarray_size(detections); i1++) {

                apriltag_detection_t *det1;
                zarray_get(detections, i1, &det1);

                if (det0->id != det1->id || det0->family != det1->family)
                    continue;

                for (int k = 0; k < 4; k++)
                    zarray_set(poly1, k, det1->p[k], NULL);

                if (g2d_polygon_overlaps_polygon(poly0, poly1)) {
                    // the tags overlap. Delete one, keep the other.

                    int pref = 0; // 0 means undecided which one we'll keep.
                    pref = prefer_smaller(pref, det0->hamming, det1->hamming);     // want small hamming
                    pref = prefer_smaller(pref, -det0->decision_margin, -det1->decision_margin);      // want bigger margins

                    // if we STILL don't prefer one detection over the other, then pick
                    // any deterministic criterion.
                    for (int i = 0; i < 4; i++) {
                        pref = prefer_smaller(pref, det0->p[i][0], det1->p[i][0]);
                        pref = prefer_smaller(pref, det0->p[i][1], det1->p[i][1]);
                    }

                    if (pref == 0) {
                        // at this point, we should only be undecided if the tag detections
                        // are *exactly* the same. How would that happen?
                        printf("uh oh, no preference for overlappingdetection\n");
                    }

                    if (pref < 0) {
                        // keep det0, destroy det1
                        apriltag_detection_destroy(det1);
                        zarray_remove_index(detections, i1, 1);
                        i1--; // retry the same index
                        goto retry1;
                    } else {
                        // keep det1, destroy det0
                        apriltag_detection_destroy(det0);
                        zarray_remove_index(detections, i0, 1);
                        i0--; // retry the same index.
                        goto retry0;
                    }
                }

              retry1: ;
            }

          retry0: ;
        }

        zarray_destroy(poly0);
        zarray_destroy(poly1);
    }

    timeprofile_stamp(td->tp, "reconcile");

    ////////////////////////////////////////////////////////////////
    // Produce final debug output
    if (td->debug) {

        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        // assume letter, which is 612x792 points.
        FILE *f = fopen("debug_output.ps", "w");
        fprintf(f, "%%!PS\n\n");
        double scale = fmin(612.0/darker->width, 792.0/darker->height);
        fprintf(f, "%f %f scale\n", scale, scale);
        fprintf(f, "0 %d translate\n", darker->height);
        fprintf(f, "1 -1 scale\n");
        postscript_image(f, darker);

        image_u8_destroy(darker);

        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            fprintf(f, "%f %f %f setrgbcolor\n", rgb[0]/255.0f, rgb[1]/255.0f, rgb[2]/255.0f);
            fprintf(f, "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",
                    det->p[0][0], det->p[0][1],
                    det->p[1][0], det->p[1][1],
                    det->p[2][0], det->p[2][1],
                    det->p[3][0], det->p[3][1],
                    det->p[0][0], det->p[0][1]);
        }

        fprintf(f, "showpage\n");
        fclose(f);
    }

    if (td->debug) {
        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        image_u8x3_t *out = image_u8x3_create(darker->width, darker->height);
        for (int y = 0; y < im_orig->height; y++) {
            for (int x = 0; x < im_orig->width; x++) {
                out->buf[y*out->stride + 3*x + 0] = darker->buf[y*darker->stride + x];
                out->buf[y*out->stride + 3*x + 1] = darker->buf[y*darker->stride + x];
                out->buf[y*out->stride + 3*x + 2] = darker->buf[y*darker->stride + x];
            }
        }

        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            for (int j = 0; j < 4; j++) {
                int k = (j + 1) & 3;
                image_u8x3_draw_line(out,
                                     det->p[j][0], det->p[j][1], det->p[k][0], det->p[k][1],
                                     (uint8_t[]) { rgb[0], rgb[1], rgb[2] },
                                     1);
            }
        }

        image_u8x3_write_pnm(out, "debug_output.pnm");
        image_u8x3_destroy(out);
    }

    // deallocate
    if (td->debug) {
        FILE *f = fopen("debug_quads.ps", "w");
        fprintf(f, "%%!PS\n\n");

        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        // assume letter, which is 612x792 points.
        double scale = fmin(612.0/darker->width, 792.0/darker->height);
        fprintf(f, "%f %f scale\n", scale, scale);
        fprintf(f, "0 %d translate\n", darker->height);
        fprintf(f, "1 -1 scale\n");

        postscript_image(f, darker);

        image_u8_destroy(darker);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *q;
            zarray_get_volatile(quads, i, &q);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            fprintf(f, "%f %f %f setrgbcolor\n", rgb[0]/255.0f, rgb[1]/255.0f, rgb[2]/255.0f);
            fprintf(f, "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",
                    q->p[0][0], q->p[0][1],
                    q->p[1][0], q->p[1][1],
                    q->p[2][0], q->p[2][1],
                    q->p[3][0], q->p[3][1],
                    q->p[0][0], q->p[0][1]);
        }

        fprintf(f, "showpage\n");
        fclose(f);
    }

    timeprofile_stamp(td->tp, "debug output");

    for (int i = 0; i < zarray_size(quads); i++) {
        struct quad *quad;
        zarray_get_volatile(quads, i, &quad);
        matd_destroy(quad->H);
        matd_destroy(quad->Hinv);
    }

    zarray_destroy(quads);

    zarray_sort(detections, detection_compare_function);
    timeprofile_stamp(td->tp, "cleanup");

    return detections;
}